

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

TestCaseData * __thiscall doctest::TestCaseData::operator=(TestCaseData *this,TestCaseData *param_2)

{
  long in_RSI;
  TestCaseData *in_RDI;
  String *unaff_retaddr;
  
  String::operator=(unaff_retaddr,&in_RDI->m_file);
  memcpy(&in_RDI->m_line,(void *)(in_RSI + 0x18),0x38);
  return in_RDI;
}

Assistant:

struct DOCTEST_INTERFACE TestCaseData
    {
        String      m_file;       // the file in which the test was registered (using String - see #350)
        unsigned    m_line;       // the line where the test was registered
        const char* m_name;       // name of the test case
        const char* m_test_suite; // the test suite in which the test was added
        const char* m_description;
        bool        m_skip;
        bool        m_no_breaks;
        bool        m_no_output;
        bool        m_may_fail;
        bool        m_should_fail;
        int         m_expected_failures;
        double      m_timeout;
    }